

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void test_misc(void)

{
  allocator local_b51;
  string local_b50;
  allocator local_b29;
  string local_b28;
  allocator local_b01;
  string local_b00;
  allocator local_ad9;
  string local_ad8;
  allocator local_ab1;
  string local_ab0;
  allocator local_a89;
  string local_a88;
  allocator local_a61;
  string local_a60;
  allocator local_a39;
  string local_a38;
  allocator local_a11;
  string local_a10;
  allocator local_9e9;
  string local_9e8;
  allocator local_9c1;
  string local_9c0;
  allocator local_999;
  string local_998;
  allocator local_971;
  string local_970;
  allocator local_949;
  string local_948;
  allocator local_921;
  string local_920;
  allocator local_8f9;
  string local_8f8;
  allocator local_8d1;
  string local_8d0;
  allocator local_8a9;
  string local_8a8;
  allocator local_881;
  string local_880;
  allocator local_859;
  string local_858;
  allocator local_831;
  string local_830;
  allocator local_809;
  string local_808;
  allocator local_7e1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  allocator local_769;
  string local_768;
  allocator local_741;
  string local_740;
  allocator local_719;
  string local_718;
  allocator local_6f1;
  string local_6f0;
  allocator local_6c9;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"(not 5)",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"#f",&local_61);
  run_test(&local_28,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"(not #f)",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"#t",&local_b1);
  run_test(&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"(boolean/and #f #t #t)",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"#f",&local_101);
  run_test(&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"(boolean/and \'f #t #t)",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"#t",&local_151);
  run_test(&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"(boolean/or #f)",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"#f",&local_1a1);
  run_test(&local_178,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"(boolean/or #f #t #t)",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"#t",&local_1f1);
  run_test(&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"(symbol? \'car)",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"#t",&local_241);
  run_test(&local_218,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"(symbol? \"car\")",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"#f",&local_291);
  run_test(&local_268,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b8,"(symbol? (string->uninterned-symbol \"car\"))",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"#t",&local_2e1);
  run_test(&local_2b8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,"(equal? \"Kek\" (symbol->string (string->symbol \"Kek\")))",
             &local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"#t",&local_331);
  run_test(&local_308,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_358,"(equal? \'Kek (string->symbol \"Kek\"))",&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"#f",&local_381);
  run_test(&local_358,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"(equal? \'Kek (intern \"Kek\"))",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"#t",&local_3d1);
  run_test(&local_3a8,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f8,"\'Kek",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"\'kek",&local_421);
  run_test(&local_3f8,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_448,
             "(eq? (string->uninterned-symbol \"car\") (string->uninterned-symbol \"car\"))",
             &local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"#f",&local_471);
  run_test(&local_448,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"(symbol-append \'foo- \'bar)",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"\'foo-bar",&local_4c1);
  run_test(&local_498,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e8,"(symbol-append \'foo- (string->uninterned-symbol \"baz\"))",
             &local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"\'foo-baz",&local_511);
  run_test(&local_4e8,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,"(symbol-append \'foo- (string->symbol \"BAZ\"))",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,"(string->symbol \"foo-BAZ\")",&local_561);
  run_test(&local_538,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"(symbol<? \'a \'b)",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"#t",&local_5b1);
  run_test(&local_588,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"(symbol<? \'B \'a)",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"#f",&local_601);
  run_test(&local_5d8,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"(cell? (make-cell make-cell))",&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,"#t",&local_651);
  run_test(&local_628,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"(cell-contents (make-cell 42))",&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,"42",&local_6a1);
  run_test(&local_678,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6c8,
             "(define c (make-cell 42)) (set-cell-contents! c 37) (cell-contents c)",&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"37",&local_6f1);
  run_test(&local_6c8,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"(force (delay (+ 1 2)))",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_740,"3",&local_741);
  run_test(&local_718,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_768,
             "(equal? (let ((p (delay (+ 1 2)))) (list (force p) (force p))) \'(3 3))",&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_790,"#t",&local_791);
  run_test(&local_768,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b8,"(define p (delay 5)) (promise-forced? p)",&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"#f",&local_7e1);
  run_test(&local_7b8,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_808,"(define p (delay 5)) (force p) (promise-forced? p)",&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_830,"#t",&local_831);
  run_test(&local_808,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_858,"(define p (delay 5)) (force p) (promise-value p)",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_880,"5",&local_881);
  run_test(&local_858,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8a8,
             "(define count 0) (define p (delay (begin (set! count (+ count 1)) (* x 3)))) (define x 5) (force p) (force p) count"
             ,&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"1",&local_8d1);
  run_test(&local_8a8,&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8f8,"(define p (weak-cons 37 42)) (weak-pair/car? p)",&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_920,"#f",&local_921);
  run_test(&local_8f8,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_948,"(define a 37) (define p (weak-cons a 42)) (weak-pair/car? p)",
             &local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_970,"#t",&local_971);
  run_test(&local_948,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_998,"(define a 37) (define p (weak-cons a 42)) (weak-car p)",
             &local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9c0,"37",&local_9c1);
  run_test(&local_998,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::__cxx11::string::~string((string *)&local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9e8,
             "(define a 37) (define p (weak-cons a 42)) (define a) (weak-pair/car? p)",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a10,"#f",&local_a11);
  run_test(&local_9e8,&local_a10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a38,
             "(define a 37) (define p (weak-cons a 42)) (define a) (weak-car p)",&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a60,"#f",&local_a61);
  run_test(&local_a38,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a88,"(define p (weak-cons 37 42)) (weak-set-car! p car) (weak-car p)",
             &local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ab0,"car",&local_ab1);
  run_test(&local_a88,&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ad8,"(define p (weak-cons 37 42)) (weak-cdr p)",&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b00,"42",&local_b01);
  run_test(&local_ad8,&local_b00);
  std::__cxx11::string::~string((string *)&local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b28,"(define p (weak-cons 37 42)) (weak-set-cdr! p 337) (weak-cdr p)",
             &local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b50,"337",&local_b51);
  run_test(&local_b28,&local_b50);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  return;
}

Assistant:

static void test_misc()
{
    run_test("(not 5)", "#f");
    run_test("(not #f)", "#t");
    run_test("(boolean/and #f #t #t)", "#f");
    run_test("(boolean/and 'f #t #t)", "#t");
    run_test("(boolean/or #f)", "#f");
    run_test("(boolean/or #f #t #t)", "#t");

    run_test("(symbol? 'car)", "#t");
    run_test("(symbol? \"car\")", "#f");
    run_test("(symbol? (string->uninterned-symbol \"car\"))", "#t");
    run_test("(equal? \"Kek\" (symbol->string (string->symbol \"Kek\")))", "#t");
    run_test("(equal? 'Kek (string->symbol \"Kek\"))", "#f");
    run_test("(equal? 'Kek (intern \"Kek\"))", "#t");
    run_test("'Kek", "'kek");
    run_test("(eq? (string->uninterned-symbol \"car\") (string->uninterned-symbol \"car\"))", "#f");
    run_test("(symbol-append 'foo- 'bar)", "'foo-bar");
    run_test("(symbol-append 'foo- (string->uninterned-symbol \"baz\"))", "'foo-baz");
    run_test("(symbol-append 'foo- (string->symbol \"BAZ\"))", "(string->symbol \"foo-BAZ\")");
    run_test("(symbol<? 'a 'b)", "#t");
    run_test("(symbol<? 'B 'a)", "#f");

    run_test("(cell? (make-cell make-cell))", "#t");
    run_test("(cell-contents (make-cell 42))", "42");
    run_test("(define c (make-cell 42)) (set-cell-contents! c 37) (cell-contents c)", "37");

    run_test("(force (delay (+ 1 2)))", "3");
    run_test("(equal? (let ((p (delay (+ 1 2)))) (list (force p) (force p))) '(3 3))", "#t");
    run_test("(define p (delay 5)) (promise-forced? p)", "#f");
    run_test("(define p (delay 5)) (force p) (promise-forced? p)", "#t");
    run_test("(define p (delay 5)) (force p) (promise-value p)", "5");
    run_test("(define count 0) (define p (delay (begin (set! count (+ count 1)) (* x 3)))) (define x 5) "
             "(force p) (force p) count", "1");

    run_test("(define p (weak-cons 37 42)) (weak-pair/car? p)", "#f");
    run_test("(define a 37) (define p (weak-cons a 42)) (weak-pair/car? p)", "#t");
    run_test("(define a 37) (define p (weak-cons a 42)) (weak-car p)", "37");
    run_test("(define a 37) (define p (weak-cons a 42)) (define a) (weak-pair/car? p)", "#f");
    run_test("(define a 37) (define p (weak-cons a 42)) (define a) (weak-car p)", "#f");
    run_test("(define p (weak-cons 37 42)) (weak-set-car! p car) (weak-car p)", "car");
    run_test("(define p (weak-cons 37 42)) (weak-cdr p)", "42");
    run_test("(define p (weak-cons 37 42)) (weak-set-cdr! p 337) (weak-cdr p)", "337");
}